

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintWriter.cpp
# Opt level: O2

void __thiscall
OpenMD::ConstraintWriter::writeConstraintForces
          (ConstraintWriter *this,
          list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *constraints)

{
  undefined8 *puVar1;
  RealType RVar2;
  ConstraintWriter *pCVar3;
  ostream *poVar4;
  int k;
  int iVar5;
  _List_node_base *p_Var6;
  int i;
  ulong uVar7;
  pointer pCVar8;
  int atom1_1;
  int local_bc;
  RealType local_b8;
  bool local_b0;
  int printForce;
  int atom2_1;
  int doPrint;
  int atom2;
  int atom1;
  int myNode;
  int nproc;
  RealType constraintForce;
  pointer pCStack_80;
  pointer local_78;
  ConstraintWriter *local_70;
  RealType force;
  vector<int,_std::allocator<int>_> nConstraints;
  MPI_Status ierr;
  
  local_70 = this;
  MPI_Comm_size(&ompi_mpi_comm_world,&nproc);
  MPI_Comm_rank(&ompi_mpi_comm_world,&myNode);
  ierr.MPI_SOURCE = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&nConstraints,(long)nproc,&ierr.MPI_SOURCE,(allocator_type *)&constraintForce);
  nConstraints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[myNode] =
       (int)(constraints->
            super__List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>).
            _M_impl._M_node._M_size;
  MPI_Allreduce(1,nConstraints.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,nproc,&ompi_mpi_int,&ompi_mpi_op_sum,
                &ompi_mpi_comm_world);
  if (myNode == 0) {
    local_78 = (pointer)0x0;
    constraintForce = 0.0;
    pCStack_80 = (pointer)0x0;
    for (uVar7 = 0; pCVar3 = local_70, pCVar8 = (pointer)constraintForce, (long)uVar7 < (long)nproc;
        uVar7 = uVar7 + 1) {
      p_Var6 = (_List_node_base *)constraints;
      if (uVar7 == 0) {
        while (p_Var6 = (((_List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                           *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var6 != (_List_node_base *)constraints) {
          puVar1 = &(p_Var6[1]._M_next)->_M_next;
          atom1_1 = *(int *)(*(long *)*puVar1 + 0x28);
          local_bc = *(int *)(*(long *)puVar1[1] + 0x28);
          local_b8 = (RealType)puVar1[3];
          local_b0 = *(bool *)(puVar1 + 4);
          std::vector<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_>::push_back
                    ((vector<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_> *)
                     &constraintForce,(value_type *)&atom1_1);
        }
      }
      else {
        for (iVar5 = 0;
            iVar5 < nConstraints.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7]; iVar5 = iVar5 + 1) {
          MPI_Recv(&atom1,1,&ompi_mpi_int,uVar7 & 0xffffffff,0,&ompi_mpi_comm_world,&ierr);
          MPI_Recv(&atom2,1,&ompi_mpi_int,uVar7 & 0xffffffff,0,&ompi_mpi_comm_world,&ierr);
          MPI_Recv(&force,1,&ompi_mpi_double,uVar7 & 0xffffffff,0,&ompi_mpi_comm_world,&ierr);
          MPI_Recv(&doPrint,1,&ompi_mpi_int,uVar7 & 0xffffffff,0,&ompi_mpi_comm_world,&ierr);
          atom1_1 = atom1;
          local_bc = atom2;
          local_b0 = doPrint != 0;
          local_b8 = force;
          std::vector<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_>::push_back
                    ((vector<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_> *)
                     &constraintForce,(value_type *)&atom1_1);
        }
      }
    }
    for (; pCVar8 != pCStack_80; pCVar8 = pCVar8 + 1) {
      if (pCVar8->printForce == true) {
        RVar2 = Snapshot::getTime(pCVar3->info_->sman_->currentSnapshot_);
        poVar4 = std::ostream::_M_insert<double>(RVar2);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pCVar8->atom1);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pCVar8->atom2);
        std::operator<<(poVar4,"\t");
        poVar4 = std::ostream::_M_insert<double>(pCVar8->constraintForce);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    std::_Vector_base<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_>::
    ~_Vector_base((_Vector_base<OpenMD::ConstraintData,_std::allocator<OpenMD::ConstraintData>_> *)
                  &constraintForce);
  }
  else {
    p_Var6 = (_List_node_base *)constraints;
    while (p_Var6 = (((_List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)constraints) {
      puVar1 = &(p_Var6[1]._M_next)->_M_next;
      atom1_1 = *(int *)(*(long *)*puVar1 + 0x28);
      atom2_1 = *(int *)(*(long *)puVar1[1] + 0x28);
      constraintForce = (RealType)puVar1[3];
      printForce = (int)*(byte *)(puVar1 + 4);
      MPI_Send(&atom1_1,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
      MPI_Send(&atom2_1,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
      MPI_Send(&constraintForce,1,&ompi_mpi_double,0,0,&ompi_mpi_comm_world);
      MPI_Send(&printForce,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nConstraints.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ConstraintWriter::writeConstraintForces(
      const std::list<ConstraintPair*>& constraints) {
#ifndef IS_MPI
    std::list<ConstraintPair*>::const_iterator i;
    for (i = constraints.begin(); i != constraints.end(); ++i) {
      if ((*i)->getPrintForce()) {
        output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
                << "\t" << (*i)->getConsElem1()->getGlobalIndex() << "\t"
                << (*i)->getConsElem2()->getGlobalIndex() << "\t"
                << (*i)->getConstraintForce() << std::endl;
      }
    }
#else

    const int primaryNode = 0;
    int nproc;
    int myNode;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);
    MPI_Comm_rank(MPI_COMM_WORLD, &myNode);

    std::vector<int> nConstraints(nproc, 0);
    nConstraints[myNode] = constraints.size();

    // do MPI_ALLREDUCE to exchange the total number of constraints:
    MPI_Allreduce(MPI_IN_PLACE, &nConstraints[0], nproc, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    MPI_Status ierr;
    int atom1, atom2, doPrint;
    RealType force;

    if (myNode == primaryNode) {
      std::vector<ConstraintData> constraintData;
      ConstraintData tmpData;
      for (int i = 0; i < nproc; ++i) {
        if (i == primaryNode) {
          std::list<ConstraintPair*>::const_iterator j;
          for (j = constraints.begin(); j != constraints.end(); ++j) {
            tmpData.atom1           = (*j)->getConsElem1()->getGlobalIndex();
            tmpData.atom2           = (*j)->getConsElem2()->getGlobalIndex();
            tmpData.constraintForce = (*j)->getConstraintForce();
            tmpData.printForce      = (*j)->getPrintForce();
            constraintData.push_back(tmpData);
          }

        } else {
          for (int k = 0; k < nConstraints[i]; ++k) {
            MPI_Recv(&atom1, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&atom2, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&force, 1, MPI_REALTYPE, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&doPrint, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);

            tmpData.atom1           = atom1;
            tmpData.atom2           = atom2;
            tmpData.constraintForce = force;
            tmpData.printForce      = (doPrint == 0) ? false : true;
            constraintData.push_back(tmpData);
          }
        }
      }

      std::vector<ConstraintData>::iterator l;
      for (l = constraintData.begin(); l != constraintData.end(); ++l) {
        if (l->printForce) {
          output_
              << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
              << "\t" << l->atom1 << "\t" << l->atom2 << "\t"
              << l->constraintForce << std::endl;
        }
      }
    } else {
      std::list<ConstraintPair*>::const_iterator j;
      for (j = constraints.begin(); j != constraints.end(); ++j) {
        int atom1                = (*j)->getConsElem1()->getGlobalIndex();
        int atom2                = (*j)->getConsElem2()->getGlobalIndex();
        RealType constraintForce = (*j)->getConstraintForce();
        int printForce           = (int)(*j)->getPrintForce();

        MPI_Send(&atom1, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&atom2, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&constraintForce, 1, MPI_REALTYPE, primaryNode, 0,
                 MPI_COMM_WORLD);
        MPI_Send(&printForce, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
      }
    }
#endif
  }